

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
::initialize_slots(raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
                   *this)

{
  ctrl_t *__s;
  ulong uVar1;
  Layout LVar2;
  
  if (this->capacity_ == 0) {
    __assert_fail("capacity_",
                  "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x70a,
                  "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void *, VectorClock<>>, phmap::container_internal::HashEq<void *>::Hash, phmap::container_internal::HashEq<void *>::Eq, std::allocator<std::pair<void *const, VectorClock<>>>>::initialize_slots() [Policy = phmap::container_internal::FlatHashMapPolicy<void *, VectorClock<>>, Hash = phmap::container_internal::HashEq<void *>::Hash, Eq = phmap::container_internal::HashEq<void *>::Eq, Alloc = std::allocator<std::pair<void *const, VectorClock<>>>]"
                 );
  }
  LVar2 = MakeLayout(this->capacity_);
  uVar1 = LVar2.
          super_LayoutType<sizeof___(Ts),_signed_char,_phmap::container_internal::map_slot_type<void_*,_VectorClock<>_>_>
          .size_[0] + 7 & 0xfffffffffffffff8;
  __s = (ctrl_t *)
        Allocate<8ul,std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
                  ((allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>
                    *)&this->settings_,
                   LVar2.
                   super_LayoutType<sizeof___(Ts),_signed_char,_phmap::container_internal::map_slot_type<void_*,_VectorClock<>_>_>
                   .size_[1] * 0x38 + uVar1);
  if (((ulong)__s & 7) == 0) {
    this->ctrl_ = __s;
    this->slots_ = (slot_type *)(__s + uVar1);
    memset(__s,0x80,this->capacity_ + 0x10);
    this->ctrl_[this->capacity_] = -1;
    reset_growth_left(this);
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xfc7,
                "CopyConst<Char, ElementType<N>> *phmap::container_internal::internal_layout::LayoutImpl<std::tuple<signed char, phmap::container_internal::map_slot_type<void *, VectorClock<>>>, phmap::integer_sequence<unsigned long, 0, 1>, phmap::integer_sequence<unsigned long, 0, 1>>::Pointer(Char *) const [Elements = std::tuple<signed char, phmap::container_internal::map_slot_type<void *, VectorClock<>>>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1>, N = 0UL, Char = char]"
               );
}

Assistant:

void initialize_slots() {
        assert(capacity_);
        if (std::is_same<SlotAlloc, std::allocator<slot_type>>::value && 
            slots_ == nullptr) {
            infoz_ = Sample();
        }

        auto layout = MakeLayout(capacity_);
        char* mem = static_cast<char*>(
            Allocate<Layout::Alignment()>(&alloc_ref(), layout.AllocSize()));
        ctrl_ = reinterpret_cast<ctrl_t*>(layout.template Pointer<0>(mem));
        slots_ = layout.template Pointer<1>(mem);
        reset_ctrl();
        reset_growth_left();
        infoz_.RecordStorageChanged(size_, capacity_);
    }